

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<MyOptions>::insert_node_<false,true,false,double_const&>
          (Simplex_tree<MyOptions> *this,Siblings *sib,Vertex_handle v,double *filtration_value)

{
  bool bVar1;
  pointer ppVar2;
  Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
  *this_00;
  undefined6 in_register_00000012;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>,_bool>
  pVar4;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>
  local_50 [3];
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>
  local_38 [2];
  double *filtration_value_local;
  Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
  *pSStack_20;
  Vertex_handle v_local;
  Siblings *sib_local;
  Simplex_tree<MyOptions> *this_local;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>,_bool>
  *ins;
  
  pSStack_20 = (Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
                *)CONCAT62(in_register_00000012,v);
  filtration_value_local._6_2_ = (Vertex_handle)filtration_value;
  sib_local = sib;
  this_local = this;
  boost::container::
  flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>>,std::less<short>,void>
  ::
  try_emplace<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,boost::container::flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>>,std::less<short>,void>>*&,double_const&>
            ((flat_map<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>>,std::less<short>,void>
              *)this,(key_type *)&pSStack_20->members_,
             (Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
              **)((long)&filtration_value_local + 6),(double *)&stack0xffffffffffffffe0);
  boost::container::
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>
  ::vec_iterator(local_38,(vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>
                           *)this);
  bVar1 = has_children<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>>>*,false>>
                    ((Simplex_tree<MyOptions> *)sib,local_38);
  uVar3 = extraout_RDX;
  if (!bVar1) {
    ppVar2 = boost::container::
             vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>
             ::operator->((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_false>
                           *)this);
    this_00 = (Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
               *)operator_new(0x28);
    Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
    ::Simplex_tree_siblings(this_00,pSStack_20,filtration_value_local._6_2_);
    Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>::assign_children
              (&ppVar2->second,this_00);
    uVar3 = extraout_RDX_00;
  }
  if (((this->nodes_label_to_list_)._M_h._M_bucket_count & 1) != 0) {
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>
    ::vec_iterator(local_50,(nonconst_iterator *)this);
    update_simplex_tree_after_node_insertion((Simplex_tree<MyOptions> *)sib,local_50);
    uVar3 = extraout_RDX_01;
  }
  pVar4._8_8_ = uVar3;
  pVar4.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_> *)
       this;
  return pVar4;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }